

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

mi_page_t *
mi_segments_page_alloc
          (mi_heap_t *heap,mi_page_kind_t page_kind,size_t required,size_t block_size,
          mi_segments_tld_t *tld)

{
  mi_segments_tld_t *tld_00;
  mi_segments_tld_t *tld_01;
  mi_page_t *p;
  mi_segment_t *pmVar1;
  mi_heap_t *in_RCX;
  ulong in_RDX;
  undefined4 in_ESI;
  size_t alignment;
  size_t in_R8;
  mi_page_t *page;
  size_t slices_needed;
  size_t page_size;
  mi_page_kind_t page_kind_00;
  undefined4 in_stack_ffffffffffffffe8;
  mi_segments_tld_t *in_stack_fffffffffffffff8;
  
  alignment = 0x10000;
  if (0x80000 < in_RDX) {
    alignment = 0x80000;
  }
  tld_00 = (mi_segments_tld_t *)_mi_align_up(in_RDX,alignment);
  page_kind_00 = (mi_page_kind_t)(in_RDX >> 0x20);
  tld_01 = (mi_segments_tld_t *)((ulong)tld_00 >> 0x10);
  p = mi_segments_page_find_and_allocate(slices_needed,page._4_4_,in_stack_fffffffffffffff8);
  if (p == (mi_page_t *)0x0) {
    pmVar1 = mi_segment_reclaim_or_alloc(in_RCX,in_R8,(size_t)tld_00,tld_01);
    if (pmVar1 == (mi_segment_t *)0x0) {
      p = (mi_page_t *)0x0;
    }
    else {
      p = mi_segments_page_alloc
                    ((mi_heap_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),page_kind_00,
                     (size_t)in_RCX,in_R8,tld_00);
    }
  }
  else {
    _mi_ptr_segment(p);
    mi_segment_try_purge((mi_segment_t *)block_size,tld._7_1_);
  }
  return p;
}

Assistant:

static mi_page_t* mi_segments_page_alloc(mi_heap_t* heap, mi_page_kind_t page_kind, size_t required, size_t block_size, mi_segments_tld_t* tld)
{
  mi_assert_internal(required <= MI_LARGE_OBJ_SIZE_MAX && page_kind <= MI_PAGE_LARGE);

  // find a free page
  size_t page_size = _mi_align_up(required, (required > MI_MEDIUM_PAGE_SIZE ? MI_MEDIUM_PAGE_SIZE : MI_SEGMENT_SLICE_SIZE));
  size_t slices_needed = page_size / MI_SEGMENT_SLICE_SIZE;
  mi_assert_internal(slices_needed * MI_SEGMENT_SLICE_SIZE == page_size);
  mi_page_t* page = mi_segments_page_find_and_allocate(slices_needed, heap->arena_id, tld); //(required <= MI_SMALL_SIZE_MAX ? 0 : slices_needed), tld);
  if (page==NULL) {
    // no free page, allocate a new segment and try again
    if (mi_segment_reclaim_or_alloc(heap, slices_needed, block_size, tld) == NULL) {
      // OOM or reclaimed a good page in the heap
      return NULL;
    }
    else {
      // otherwise try again
      return mi_segments_page_alloc(heap, page_kind, required, block_size, tld);
    }
  }
  mi_assert_internal(page != NULL && page->slice_count*MI_SEGMENT_SLICE_SIZE == page_size);
  mi_assert_internal(_mi_ptr_segment(page)->thread_id == _mi_thread_id());
  mi_segment_try_purge(_mi_ptr_segment(page), false);
  return page;
}